

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

int lookforfunc(lua_State *L,char *path,char *sym)

{
  int iVar1;
  void *pvVar2;
  
  lua_rawgetp(L,-0xf4628,&CLIBS);
  lua_getfield(L,-1,path);
  pvVar2 = lua_touserdata(L,-1);
  lua_settop(L,-3);
  if (pvVar2 == (void *)0x0) {
    lua_pushstring(L,"dynamic libraries not enabled; check your Lua installation");
    iVar1 = 1;
  }
  else if (*sym == '*') {
    lua_pushboolean(L,1);
    iVar1 = 0;
  }
  else {
    lua_pushstring(L,"dynamic libraries not enabled; check your Lua installation");
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int lookforfunc (lua_State *L, const char *path, const char *sym) {
  void *reg = checkclib(L, path);  /* check loaded C libraries */
  if (reg == NULL) {  /* must load library? */
    reg = lsys_load(L, path, *sym == '*');  /* global symbols if 'sym'=='*' */
    if (reg == NULL) return ERRLIB;  /* unable to load library */
    addtoclib(L, path, reg);
  }
  if (*sym == '*') {  /* loading only library (no function)? */
    lua_pushboolean(L, 1);  /* return 'true' */
    return 0;  /* no errors */
  }
  else {
    lua_CFunction f = lsys_sym(L, reg, sym);
    if (f == NULL)
      return ERRFUNC;  /* unable to find function */
    lua_pushcfunction(L, f);  /* else create new function */
    return 0;  /* no errors */
  }
}